

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

string * __thiscall ftxui::Screen::ToString_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  reference next;
  bool bVar3;
  Pixel *pixel;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  undefined1 local_210 [3];
  bool previous_fullwidth;
  int y;
  Pixel final_pixel;
  undefined1 local_1d0 [8];
  Pixel previous_pixel;
  stringstream ss;
  ostream local_190 [376];
  Screen *local_18;
  Screen *this_local;
  
  local_18 = this;
  this_local = (Screen *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&previous_pixel.field_0x28);
  Pixel::Pixel((Pixel *)local_1d0);
  Pixel::Pixel((Pixel *)local_210);
  for (__range2._4_4_ = 0; __range2._4_4_ < this->dimy_; __range2._4_4_ = __range2._4_4_ + 1) {
    if (__range2._4_4_ != 0) {
      anon_unknown_0::UpdatePixelStyle
                ((stringstream *)&previous_pixel.field_0x28,(Pixel *)local_1d0,(Pixel *)local_210);
      std::operator<<(local_190,"\r\n");
    }
    bVar3 = false;
    this_00 = std::
              vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
              ::operator[](&this->pixels_,(long)__range2._4_4_);
    __end2 = std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::begin(this_00);
    pixel = (Pixel *)std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>
                                  *)&pixel);
      if (!bVar1) break;
      next = __gnu_cxx::
             __normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>
             ::operator*(&__end2);
      if (!bVar3) {
        anon_unknown_0::UpdatePixelStyle
                  ((stringstream *)&previous_pixel.field_0x28,(Pixel *)local_1d0,next);
        std::operator<<(local_190,(string *)next);
      }
      iVar2 = string_width(&next->character);
      bVar3 = iVar2 == 2;
      __gnu_cxx::
      __normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::
      operator++(&__end2);
    }
  }
  anon_unknown_0::UpdatePixelStyle
            ((stringstream *)&previous_pixel.field_0x28,(Pixel *)local_1d0,(Pixel *)local_210);
  std::__cxx11::stringstream::str();
  Pixel::~Pixel((Pixel *)local_210);
  Pixel::~Pixel((Pixel *)local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&previous_pixel.field_0x28);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ToString() {
  std::stringstream ss;

  Pixel previous_pixel;
  Pixel final_pixel;

  for (int y = 0; y < dimy_; ++y) {
    if (y != 0) {
      UpdatePixelStyle(ss, previous_pixel, final_pixel);
      ss << "\r\n";
    }
    bool previous_fullwidth = false;
    for (const auto& pixel : pixels_[y]) {
      if (!previous_fullwidth) {
        UpdatePixelStyle(ss, previous_pixel, pixel);
        ss << pixel.character;
      }
      previous_fullwidth = (string_width(pixel.character) == 2);
    }
  }

  UpdatePixelStyle(ss, previous_pixel, final_pixel);

  return ss.str();
}